

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O0

void SHA224_256ProcessMessageBlock(SHA256Context *context)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t local_148;
  uint local_144;
  uint32_t H;
  uint32_t G;
  uint32_t F;
  uint32_t E;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uint32_t W [64];
  uint32_t temp2;
  uint32_t temp1;
  int t4;
  int t;
  SHA256Context *context_local;
  
  temp2 = 0;
  for (temp1 = 0; (int)temp1 < 0x10; temp1 = temp1 + 1) {
    (&B)[(int)temp1] =
         (uint)context->Message_Block[(int)temp2] << 0x18 |
         (uint)context->Message_Block[(int)(temp2 + 1)] << 0x10 |
         (uint)context->Message_Block[(int)(temp2 + 2)] << 8 |
         (uint)context->Message_Block[(int)(temp2 + 3)];
    temp2 = temp2 + 4;
  }
  for (temp1 = 0x10; (int)temp1 < 0x40; temp1 = temp1 + 1) {
    (&B)[(int)temp1] =
         (((&B)[(int)(temp1 - 2)] >> 0x11 | (&B)[(int)(temp1 - 2)] << 0xf) ^
          ((&B)[(int)(temp1 - 2)] >> 0x13 | (&B)[(int)(temp1 - 2)] << 0xd) ^
         (&B)[(int)(temp1 - 2)] >> 10) + (&B)[(int)(temp1 - 7)] +
         (((&B)[(int)(temp1 - 0xf)] >> 7 | (&B)[(int)(temp1 - 0xf)] << 0x19) ^
          ((&B)[(int)(temp1 - 0xf)] >> 0x12 | (&B)[(int)(temp1 - 0xf)] << 0xe) ^
         (&B)[(int)(temp1 - 0xf)] >> 3) + (&B)[(int)(temp1 - 0x10)];
  }
  C = context->Intermediate_Hash[0];
  D = context->Intermediate_Hash[1];
  E = context->Intermediate_Hash[2];
  F = context->Intermediate_Hash[3];
  G = context->Intermediate_Hash[4];
  H = context->Intermediate_Hash[5];
  local_144 = context->Intermediate_Hash[6];
  local_148 = context->Intermediate_Hash[7];
  for (temp1 = 0; (int)temp1 < 0x40; temp1 = temp1 + 1) {
    iVar1 = local_148 + ((G >> 6 | G << 0x1a) ^ (G >> 0xb | G << 0x15) ^ (G >> 0x19 | G << 7)) +
            (G & H ^ (G ^ 0xffffffff) & local_144) + SHA224_256ProcessMessageBlock::K[(int)temp1] +
            (&B)[(int)temp1];
    uVar2 = C & D;
    uVar3 = C & E;
    uVar4 = D & E;
    local_148 = local_144;
    local_144 = H;
    H = G;
    G = F + iVar1;
    F = E;
    E = D;
    D = C;
    C = iVar1 + ((C >> 2 | C << 0x1e) ^ (C >> 0xd | C << 0x13) ^ (C >> 0x16 | C << 10)) +
                (uVar2 ^ uVar3 ^ uVar4);
  }
  context->Intermediate_Hash[0] = C + context->Intermediate_Hash[0];
  context->Intermediate_Hash[1] = D + context->Intermediate_Hash[1];
  context->Intermediate_Hash[2] = E + context->Intermediate_Hash[2];
  context->Intermediate_Hash[3] = F + context->Intermediate_Hash[3];
  context->Intermediate_Hash[4] = G + context->Intermediate_Hash[4];
  context->Intermediate_Hash[5] = H + context->Intermediate_Hash[5];
  context->Intermediate_Hash[6] = local_144 + context->Intermediate_Hash[6];
  context->Intermediate_Hash[7] = local_148 + context->Intermediate_Hash[7];
  context->Message_Block_Index = 0;
  return;
}

Assistant:

static void SHA224_256ProcessMessageBlock(SHA256Context *context)
{
    /* Constants defined in FIPS-180-2, section 4.2.2 */
    static const uint32_t K[64] = {
        0x428a2f98, 0x71374491, 0xb5c0fbcf, 0xe9b5dba5, 0x3956c25b,
        0x59f111f1, 0x923f82a4, 0xab1c5ed5, 0xd807aa98, 0x12835b01,
        0x243185be, 0x550c7dc3, 0x72be5d74, 0x80deb1fe, 0x9bdc06a7,
        0xc19bf174, 0xe49b69c1, 0xefbe4786, 0x0fc19dc6, 0x240ca1cc,
        0x2de92c6f, 0x4a7484aa, 0x5cb0a9dc, 0x76f988da, 0x983e5152,
        0xa831c66d, 0xb00327c8, 0xbf597fc7, 0xc6e00bf3, 0xd5a79147,
        0x06ca6351, 0x14292967, 0x27b70a85, 0x2e1b2138, 0x4d2c6dfc,
        0x53380d13, 0x650a7354, 0x766a0abb, 0x81c2c92e, 0x92722c85,
        0xa2bfe8a1, 0xa81a664b, 0xc24b8b70, 0xc76c51a3, 0xd192e819,
        0xd6990624, 0xf40e3585, 0x106aa070, 0x19a4c116, 0x1e376c08,
        0x2748774c, 0x34b0bcb5, 0x391c0cb3, 0x4ed8aa4a, 0x5b9cca4f,
        0x682e6ff3, 0x748f82ee, 0x78a5636f, 0x84c87814, 0x8cc70208,
        0x90befffa, 0xa4506ceb, 0xbef9a3f7, 0xc67178f2
    };
    int        t, t4;                   /* Loop counter */
    uint32_t   temp1, temp2;            /* Temporary word value */
    uint32_t   W[64];                   /* Word sequence */
    uint32_t   A, B, C, D, E, F, G, H;  /* Word buffers */

    /*
    * Initialize the first 16 words in the array W
    */
    for (t = t4 = 0; t < 16; t++, t4 += 4)
    {
        W[t] = (((uint32_t)context->Message_Block[t4]) << 24) |
            (((uint32_t)context->Message_Block[t4 + 1]) << 16) |
            (((uint32_t)context->Message_Block[t4 + 2]) << 8) |
            (((uint32_t)context->Message_Block[t4 + 3]));
    }
    for (t = 16; t < 64; t++)
    {
        W[t] = SHA256_sigma1(W[t - 2]) + W[t - 7] +
            SHA256_sigma0(W[t - 15]) + W[t - 16];
    }
    A = context->Intermediate_Hash[0];
    B = context->Intermediate_Hash[1];
    C = context->Intermediate_Hash[2];
    D = context->Intermediate_Hash[3];
    E = context->Intermediate_Hash[4];
    F = context->Intermediate_Hash[5];
    G = context->Intermediate_Hash[6];
    H = context->Intermediate_Hash[7];

    for (t = 0; t < 64; t++)
    {
        temp1 = H + SHA256_SIGMA1(E) + SHA_Ch(E, F, G) + K[t] + W[t];
        temp2 = SHA256_SIGMA0(A) + SHA_Maj(A, B, C);
        H = G;
        G = F;
        F = E;
        E = D + temp1;
        D = C;
        C = B;
        B = A;
        A = temp1 + temp2;
    }

    context->Intermediate_Hash[0] += A;
    context->Intermediate_Hash[1] += B;
    context->Intermediate_Hash[2] += C;
    context->Intermediate_Hash[3] += D;
    context->Intermediate_Hash[4] += E;
    context->Intermediate_Hash[5] += F;
    context->Intermediate_Hash[6] += G;
    context->Intermediate_Hash[7] += H;

    context->Message_Block_Index = 0;
}